

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

void __thiscall
Json::BuiltStyledStreamWriter::writeWithIndent(BuiltStyledStreamWriter *this,string *value)

{
  BuiltStyledStreamWriter *in_RSI;
  long in_RDI;
  
  if ((*(byte *)(in_RDI + 0xd8) >> 1 & 1) == 0) {
    writeIndent(in_RSI);
  }
  std::operator<<(*(ostream **)(in_RDI + 8),(string *)in_RSI);
  *(byte *)(in_RDI + 0xd8) = *(byte *)(in_RDI + 0xd8) & 0xfd;
  return;
}

Assistant:

void BuiltStyledStreamWriter::writeWithIndent(std::string const& value) {
  if (!indented_) writeIndent();
  *sout_ << value;
  indented_ = false;
}